

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_setfield(lua_State *L,int idx,char *k)

{
  TValue *pTVar1;
  lua_State *L_00;
  TValue *o_00;
  size_t lenx;
  TValue *base;
  cTValue *t;
  TValue key;
  TValue *o;
  char *k_local;
  lua_State *plStack_f0;
  int idx_local;
  lua_State *L_local;
  TValue *local_e0;
  lua_State *local_d8;
  GCstr *local_b8;
  cTValue **local_b0;
  lua_State *local_a8;
  TValue *local_a0;
  TValue *o_1;
  lua_State *local_90;
  char *local_70;
  TValue *local_68;
  lua_State *local_60;
  undefined4 local_54;
  GCstr *local_50;
  cTValue **local_48;
  lua_State *local_40;
  undefined4 local_34;
  GCstr *local_30;
  cTValue **local_28;
  char *local_20;
  cTValue **local_18;
  lua_State *local_10;
  
  o = (TValue *)k;
  k_local._4_4_ = idx;
  plStack_f0 = L;
  o_1._4_4_ = idx;
  local_90 = L;
  o_00 = index2adr(L,idx);
  L_00 = plStack_f0;
  pTVar1 = o;
  local_a0 = o_00;
  lenx = strlen((char *)&o->it64);
  local_b8 = lj_str_new(L_00,(char *)&pTVar1->it64,lenx);
  local_a8 = L_00;
  local_b0 = &t;
  local_40 = L_00;
  local_54 = 0xfffffffb;
  local_34 = 0xfffffffb;
  t = (cTValue *)((ulong)local_b8 | 0xfffd800000000000);
  local_10 = L_00;
  local_20 = "store to dead GC object";
  local_50 = local_b8;
  local_48 = local_b0;
  local_30 = local_b8;
  local_28 = local_b0;
  local_18 = local_b0;
  key = (TValue)lj_meta_tset(plStack_f0,o_00,(cTValue *)&t);
  if ((TValue *)key.u64 == (TValue *)0x0) {
    pTVar1 = plStack_f0->top;
    local_e0 = pTVar1 + 2;
    L_local = (lua_State *)(pTVar1 + -5);
    local_d8 = plStack_f0;
    (local_e0->gcr).gcptr64 = ((uint64_t)*(GCRef *)L_local).gcptr64;
    local_60 = plStack_f0;
    local_70 = "copy of dead GC object";
    plStack_f0->top = pTVar1 + 3;
    local_68 = local_e0;
    lj_vm_call(plStack_f0,pTVar1,1);
    plStack_f0->top = plStack_f0->top + -3;
  }
  else {
    pTVar1 = plStack_f0->top;
    plStack_f0->top = pTVar1 + -1;
    *(TValue *)key = pTVar1[-1];
  }
  return;
}

Assistant:

LUA_API void lua_setfield(lua_State *L, int idx, const char *k)
{
  TValue *o;
  TValue key;
  cTValue *t = index2adr_check(L, idx);
  lj_checkapi_slot(1);
  setstrV(L, &key, lj_str_newz(L, k));
  o = lj_meta_tset(L, t, &key);
  if (o) {
    /* NOBARRIER: lj_meta_tset ensures the table is not black. */
    copyTV(L, o, --L->top);
  } else {
    TValue *base = L->top;
    copyTV(L, base+2, base-3-2*LJ_FR2);
    L->top = base+3;
    lj_vm_call(L, base, 0+1);
    L->top -= 2+LJ_FR2;
  }
}